

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_BrFncNeqApply(Var instance,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ThreadContext *threadContext;
  undefined4 *puVar4;
  RecyclableObject *this;
  FunctionProxy *this_00;
  ProxyEntryPointInfo *entryPoint;
  JavascriptMethod p_Var5;
  FunctionInfo *this_01;
  FunctionInfo *info;
  FunctionProxy *bod;
  undefined1 local_58 [8];
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  Var instance_local;
  TypeId local_18;
  TypeId typeId;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_58,threadContext);
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(instance);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(instance);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this = UnsafeVarTo<Js::RecyclableObject>(instance);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  if (local_18 == TypeIds_Function) {
    this_00 = JavascriptFunction::GetFunctionProxy((JavascriptFunction *)instance);
    if (this_00 == (FunctionProxy *)0x0) {
      this_01 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)instance);
      if (this_01 == (FunctionInfo *)0x0) {
        instance_local._4_4_ = 1;
      }
      else {
        p_Var5 = FunctionInfo::GetOriginalEntryPoint(this_01);
        instance_local._4_4_ = (uint)(p_Var5 != JavascriptFunction::EntryApply);
      }
    }
    else {
      entryPoint = FunctionProxy::GetDefaultEntryPointInfo(this_00);
      p_Var5 = FunctionProxy::GetDirectEntryPoint(this_00,entryPoint);
      instance_local._4_4_ = (uint)(p_Var5 != JavascriptFunction::EntryApply);
    }
  }
  else {
    instance_local._4_4_ = 1;
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_58);
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::OP_BrFncNeqApply(Var instance, ScriptContext *scriptContext)
     {
         JIT_HELPER_NOT_REENTRANT_HEADER(Op_OP_BrFncNeqApply, reentrancylock, scriptContext->GetThreadContext());
         // JavascriptFunction and !HostDispatch
         if (JavascriptOperators::GetTypeId(instance) == TypeIds_Function)
         {
             FunctionProxy *bod = ((JavascriptFunction *)instance)->GetFunctionProxy();
             if (bod != nullptr)
             {
                 return bod->GetDirectEntryPoint(bod->GetDefaultEntryPointInfo()) != &Js::JavascriptFunction::EntryApply;
             }
             else
             {
                 FunctionInfo* info = ((JavascriptFunction *)instance)->GetFunctionInfo();
                 if (info != nullptr)
                 {
                     return &Js::JavascriptFunction::EntryApply != info->GetOriginalEntryPoint();
                 }
                 else
                 {
                     return true;
                 }
             }
         }

         return true;
         JIT_HELPER_END(Op_OP_BrFncNeqApply);
     }